

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O0

cpstring * __thiscall
(anonymous_namespace)::Utf8Decode::decode_abi_cxx11_
          (cpstring *__return_storage_ptr__,void *this,bytes *input,bool good)

{
  utf8_decoder *this_00;
  bool bVar1;
  uchar *src;
  char *message;
  AssertHelper local_68;
  Message local_60 [3];
  bool local_41;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  utf8_decoder decoder;
  bool good_local;
  bytes *input_local;
  Utf8Decode *this_local;
  cpstring *result;
  
  decoder.codepoint_._2_1_ = 0;
  decoder.codepoint_._3_1_ = good;
  unique0x1000023c = input;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (input,(value_type *)((long)&decoder.codepoint_ + 2));
  this_00 = (utf8_decoder *)
            ((long)&gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 4);
  pstore::utf::utf8_decoder::utf8_decoder(this_00);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._3_1_ = 0;
  src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(stack0xffffffffffffffe0);
  decode_abi_cxx11_(__return_storage_ptr__,this,this_00,(char *)src);
  local_41 = pstore::utf::utf8_decoder::is_well_formed(this_00);
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_40,"decoder.is_well_formed ()","good",&local_41,
             (bool *)((long)&decoder.codepoint_ + 3));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_60);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_utf.cpp"
               ,0x16d,message);
    testing::internal::AssertHelper::operator=(&local_68,local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::Message::~Message(local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  return __return_storage_ptr__;
}

Assistant:

cpstring decode (bytes && input, bool good) {
            input.push_back (0x00); // add terminating NUL
            pstore::utf::utf8_decoder decoder;
            cpstring result = decode (decoder, reinterpret_cast<char const *> (input.data ()));
            EXPECT_EQ (decoder.is_well_formed (), good);
            return result;
        }